

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedjson.cpp
# Opt level: O0

bool __thiscall ParsedJson::printjson(ParsedJson *this,ostream *os)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  void *pvVar6;
  ostream *in_RSI;
  long in_RDI;
  double answer;
  uint64_t payload;
  int depth;
  size_t *inobjectidx;
  bool *inobject;
  size_t howmany;
  uint8_t type;
  uint64_t tape_val;
  size_t tapeidx;
  uchar *in_stack_ffffffffffffff40;
  int local_4c;
  ulong local_20;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    local_1 = false;
  }
  else if ((char)(**(ulong **)(in_RDI + 0x30) >> 0x38) == 'r') {
    uVar3 = **(ulong **)(in_RDI + 0x30) & 0xffffffffffffff;
    if (*(ulong *)(in_RDI + 0x10) < uVar3) {
      fprintf(_stderr,"We may be exceeding the tape capacity. Is this a valid document?\n");
      local_1 = false;
    }
    else {
      local_20 = 1;
      pvVar4 = operator_new__(*(ulong *)(in_RDI + 8));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in_RDI + 8);
      uVar5 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar5);
      local_4c = 1;
      *(undefined8 *)((long)pvVar6 + 8) = 0;
      *(undefined1 *)((long)pvVar4 + 1) = 0;
      for (; local_20 < uVar3; local_20 = local_20 + 1) {
        bVar2 = (byte)((ulong)*(undefined8 *)(*(long *)(in_RDI + 0x30) + local_20 * 8) >> 0x38);
        if ((*(byte *)((long)pvVar4 + (long)local_4c) & 1) == 0) {
          if ((*(long *)((long)pvVar6 + (long)local_4c * 8) != 0) && (bVar2 != 0x5d)) {
            std::operator<<(in_RSI,",");
          }
          *(long *)((long)pvVar6 + (long)local_4c * 8) =
               *(long *)((long)pvVar6 + (long)local_4c * 8) + 1;
        }
        else {
          if (((*(long *)((long)pvVar6 + (long)local_4c * 8) != 0) &&
              ((*(ulong *)((long)pvVar6 + (long)local_4c * 8) & 1) == 0)) && (bVar2 != 0x7d)) {
            std::operator<<(in_RSI,",");
          }
          if ((*(ulong *)((long)pvVar6 + (long)local_4c * 8) & 1) == 1) {
            std::operator<<(in_RSI,":");
          }
          *(long *)((long)pvVar6 + (long)local_4c * 8) =
               *(long *)((long)pvVar6 + (long)local_4c * 8) + 1;
        }
        switch(bVar2) {
        case 0x22:
          std::operator<<(in_RSI,'\"');
          print_with_escapes(in_stack_ffffffffffffff40);
          std::operator<<(in_RSI,'\"');
          break;
        default:
          fprintf(_stderr,"bug %c\n",(ulong)bVar2);
          if (pvVar4 != (void *)0x0) {
            operator_delete__(pvVar4);
          }
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
          return false;
        case 0x5b:
          std::operator<<(in_RSI,'[');
          local_4c = local_4c + 1;
          *(undefined1 *)((long)pvVar4 + (long)local_4c) = 0;
          *(undefined8 *)((long)pvVar6 + (long)local_4c * 8) = 0;
          break;
        case 0x5d:
          local_4c = local_4c + -1;
          std::operator<<(in_RSI,']');
          break;
        case 100:
          if (uVar3 <= local_20 + 1) {
            if (pvVar4 != (void *)0x0) {
              operator_delete__(pvVar4);
            }
            if (pvVar6 != (void *)0x0) {
              operator_delete__(pvVar6);
            }
            return false;
          }
          std::ostream::operator<<(in_RSI,*(double *)(*(long *)(in_RDI + 0x30) + 8 + local_20 * 8));
          local_20 = local_20 + 1;
          break;
        case 0x66:
          std::operator<<(in_RSI,"false");
          break;
        case 0x6c:
          if (uVar3 <= local_20 + 1) {
            if (pvVar4 != (void *)0x0) {
              operator_delete__(pvVar4);
            }
            if (pvVar6 != (void *)0x0) {
              operator_delete__(pvVar6);
            }
            return false;
          }
          std::ostream::operator<<(in_RSI,*(long *)(*(long *)(in_RDI + 0x30) + 8 + local_20 * 8));
          local_20 = local_20 + 1;
          break;
        case 0x6e:
          std::operator<<(in_RSI,"null");
          break;
        case 0x72:
          fprintf(_stderr,"should we be hitting the root node?\n");
          if (pvVar4 != (void *)0x0) {
            operator_delete__(pvVar4);
          }
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
          return false;
        case 0x74:
          std::operator<<(in_RSI,"true");
          break;
        case 0x7b:
          std::operator<<(in_RSI,'{');
          local_4c = local_4c + 1;
          *(undefined1 *)((long)pvVar4 + (long)local_4c) = 1;
          *(undefined8 *)((long)pvVar6 + (long)local_4c * 8) = 0;
          break;
        case 0x7d:
          local_4c = local_4c + -1;
          std::operator<<(in_RSI,'}');
        }
      }
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
      local_1 = true;
    }
  }
  else {
    fprintf(_stderr,"Error: no starting root node?");
    local_1 = false;
  }
  return local_1;
}

Assistant:

WARN_UNUSED
bool ParsedJson::printjson(std::ostream &os) {
    if(!isvalid) { 
      return false;
    }
    size_t tapeidx = 0;
    uint64_t tape_val = tape[tapeidx];
    uint8_t type = (tape_val >> 56);
    size_t howmany = 0;
    if (type == 'r') {
      howmany = tape_val & JSONVALUEMASK;
    } else {
      fprintf(stderr, "Error: no starting root node?");
      return false;
    }
    if (howmany > tapecapacity) {
      fprintf(stderr,
          "We may be exceeding the tape capacity. Is this a valid document?\n");
      return false;
    }
    tapeidx++;
    bool *inobject = new bool[depthcapacity];
    auto *inobjectidx = new size_t[depthcapacity];
    int depth = 1; // only root at level 0
    inobjectidx[depth] = 0;
    inobject[depth] = false;
    for (; tapeidx < howmany; tapeidx++) {
      tape_val = tape[tapeidx];
      uint64_t payload = tape_val & JSONVALUEMASK;
      type = (tape_val >> 56);
      if (!inobject[depth]) {
        if ((inobjectidx[depth] > 0) && (type != ']')) {
          os << ",";
        }
        inobjectidx[depth]++;
      } else { // if (inobject) {
        if ((inobjectidx[depth] > 0) && ((inobjectidx[depth] & 1) == 0) &&
            (type != '}')) {
          os << ",";
        }
        if (((inobjectidx[depth] & 1) == 1)) {
          os << ":";
        }
        inobjectidx[depth]++;
      }
      switch (type) {
      case '"': // we have a string
        os << '"';
        print_with_escapes((const unsigned char *)(string_buf + payload));
        os << '"';
        break;
      case 'l': // we have a long int
        if (tapeidx + 1 >= howmany) {
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        os <<  static_cast<int64_t>(tape[++tapeidx]);
        break;
      case 'd': // we have a double
        if (tapeidx + 1 >= howmany){
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        double answer;
        memcpy(&answer, &tape[++tapeidx], sizeof(answer));
        os << answer;
        break;
      case 'n': // we have a null
        os << "null";
        break;
      case 't': // we have a true
        os << "true";
        break;
      case 'f': // we have a false
        os << "false";
        break;
      case '{': // we have an object
        os << '{';
        depth++;
        inobject[depth] = true;
        inobjectidx[depth] = 0;
        break;
      case '}': // we end an object
        depth--;
        os << '}';
        break;
      case '[': // we start an array
        os << '[';
        depth++;
        inobject[depth] = false;
        inobjectidx[depth] = 0;
        break;
      case ']': // we end an array
        depth--;
        os << ']';
        break;
      case 'r': // we start and end with the root node
        fprintf(stderr, "should we be hitting the root node?\n");
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      default:
        fprintf(stderr, "bug %c\n", type);
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      }
    }
    delete[] inobject;
    delete[] inobjectidx;
    return true;
}